

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O0

void __thiscall
Am_Load_Save_Context::Register_Prototype(Am_Load_Save_Context *this,char *name,Am_Wrapper *value)

{
  Map<Wrapper_Holder,_Name_Num,_std::less<Wrapper_Holder>_> *this_00;
  Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *this_01;
  int iVar1;
  Am_Load_Save_Context_Data *this_02;
  undefined4 extraout_var;
  Wrapper_Holder local_68;
  Name_Num local_60;
  Name_Num local_50;
  Wrapper_Holder local_40;
  Wrapper_Holder local_38;
  Wrapper_Holder holder;
  Am_Wrapper *value_local;
  char *name_local;
  Am_Load_Save_Context *this_local;
  
  if (this->data == (Am_Load_Save_Context_Data *)0x0) {
    this_02 = (Am_Load_Save_Context_Data *)operator_new(0x48);
    Am_Load_Save_Context_Data::Am_Load_Save_Context_Data(this_02);
    this->data = this_02;
  }
  iVar1 = (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
  this->data = (Am_Load_Save_Context_Data *)CONCAT44(extraout_var,iVar1);
  Wrapper_Holder::Wrapper_Holder(&local_38,value);
  this_00 = this->data->names;
  Wrapper_Holder::Wrapper_Holder(&local_40,&local_38);
  Name_Num::Name_Num(&local_50,name);
  OpenAmulet::Map<Wrapper_Holder,_Name_Num,_std::less<Wrapper_Holder>_>::SetAt
            (this_00,&local_40,&local_50);
  Wrapper_Holder::~Wrapper_Holder(&local_40);
  this_01 = this->data->prototypes;
  Name_Num::Name_Num(&local_60,name);
  Wrapper_Holder::Wrapper_Holder(&local_68,&local_38);
  OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::SetAt
            (this_01,&local_60,&local_68);
  Wrapper_Holder::~Wrapper_Holder(&local_68);
  Wrapper_Holder::~Wrapper_Holder(&local_38);
  return;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}